

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O0

int32_t trun::to_int32(char *str)

{
  int iVar1;
  allocator<char> local_31;
  string local_30;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,str,&local_31);
  iVar1 = std::__cxx11::stoi(&local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return iVar1;
}

Assistant:

int32_t to_int32(const char *str) {
        return std::stoi(str);
    }